

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::writeToBinary(Binasc *this,ostream *out,istream *input)

{
  int iVar1;
  int lineCount;
  allocator local_461;
  ostream *local_460;
  string local_458;
  char inputLine [1024];
  
  local_460 = out;
  memset(inputLine,0,0x400);
  std::istream::getline((char *)input,(long)inputLine,'\0');
  lineCount = 1;
  while( true ) {
    if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) {
      return 1;
    }
    std::__cxx11::string::string((string *)&local_458,inputLine,&local_461);
    iVar1 = processLine(this,local_460,&local_458,lineCount);
    std::__cxx11::string::~string((string *)&local_458);
    if (iVar1 == 0) break;
    std::istream::getline((char *)input,(long)inputLine,'\0');
    lineCount = lineCount + 1;
  }
  return 0;
}

Assistant:

int Binasc::writeToBinary(std::ostream& out, std::istream& input) {
	char inputLine[1024] = {0};    // current line being processed
	int  lineNum = 0;              // current line number

	input.getline(inputLine, 1024, '\n');
	lineNum++;
	while (!input.eof()) {
		int status = processLine(out, inputLine, lineNum);
		if (!status) {
			return 0;
		}
		input.getline(inputLine, 1024, '\n');
		lineNum++;
	}
	return 1;
}